

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isAllowedInGenerate(SyntaxKind kind)

{
  int in_EDI;
  SyntaxKind in_stack_fffffffffffffff0;
  bool local_1;
  
  if ((in_EDI == 0x78) || (in_EDI == 0x176)) {
    local_1 = true;
  }
  else {
    local_1 = isModuleCommonItem(in_stack_fffffffffffffff0);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isAllowedInGenerate(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefParam:
        case SyntaxKind::PrimitiveInstantiation:
            return true;
        default:
            return isModuleCommonItem(kind);
    }
}